

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O0

int impl_ARB1_CompileShader(MOJOSHADER_parseData *pd,GLuint *s)

{
  GLenum GVar1;
  GLubyte *pGVar2;
  GLubyte *errstr;
  GLint pos;
  GLuint shader;
  GLenum shader_type;
  GLint shaderlen;
  GLuint *s_local;
  MOJOSHADER_parseData *pd_local;
  
  shader = pd->output_len;
  _shader_type = s;
  s_local = (GLuint *)pd;
  pos = arb1_shader_type(pd->shader_type);
  errstr._4_4_ = 0;
  (*ctx->glGenProgramsARB)(1,(GLuint *)((long)&errstr + 4));
  (*ctx->glGetError)();
  (*ctx->glBindProgramARB)(pos,errstr._4_4_);
  (*ctx->glProgramStringARB)(pos,0x8875,shader,*(GLvoid **)(s_local + 6));
  GVar1 = (*ctx->glGetError)();
  if (GVar1 != 0x502) {
    *_shader_type = errstr._4_4_;
  }
  else {
    errstr._0_4_ = 0;
    (*ctx->glGetIntegerv)(0x864b,(GLint *)&errstr);
    pGVar2 = (*ctx->glGetString)(0x8874);
    snprintf(error_buffer,0x400,"ARB1 compile error at position %d: %s",(ulong)(uint)errstr,pGVar2);
    (*ctx->glBindProgramARB)(pos,0);
    (*ctx->glDeleteProgramsARB)(1,(GLuint *)((long)&errstr + 4));
    *_shader_type = 0;
  }
  pd_local._4_4_ = (uint)(GVar1 != 0x502);
  return pd_local._4_4_;
}

Assistant:

static int impl_ARB1_CompileShader(const MOJOSHADER_parseData *pd, GLuint *s)
{
    GLint shaderlen = (GLint) pd->output_len;
    const GLenum shader_type = arb1_shader_type(pd->shader_type);
    GLuint shader = 0;
    ctx->glGenProgramsARB(1, &shader);

    ctx->glGetError();  // flush any existing error state.
    ctx->glBindProgramARB(shader_type, shader);
    ctx->glProgramStringARB(shader_type, GL_PROGRAM_FORMAT_ASCII_ARB,
                                shaderlen, pd->output);

    if (ctx->glGetError() == GL_INVALID_OPERATION)
    { 
        GLint pos = 0;
        ctx->glGetIntegerv(GL_PROGRAM_ERROR_POSITION_ARB, &pos);
        const GLubyte *errstr = ctx->glGetString(GL_PROGRAM_ERROR_STRING_ARB);
        snprintf(error_buffer, sizeof (error_buffer),
                  "ARB1 compile error at position %d: %s",
                  (int) pos, (const char *) errstr);
        ctx->glBindProgramARB(shader_type, 0);
        ctx->glDeleteProgramsARB(1, &shader);
        *s = 0;
        return 0;
    } // if

    *s = shader;
    return 1;
}